

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

void rw::gl3::writeNativeTexture(Texture *tex,Stream *stream)

{
  Raster *this;
  int iVar1;
  uint32 uVar2;
  int val;
  uint8 *puVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  byte bVar5;
  uint local_4c;
  int32 i;
  uint8 *data;
  uint32 size;
  int32 compression;
  int32 flags;
  int32 numLevels;
  int32 chunksize;
  Gl3Raster *natras;
  Raster *raster;
  Stream *stream_local;
  Texture *tex_local;
  
  iVar1 = nativeRasterOffset;
  this = tex->raster;
  uVar2 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar2 - 0xc);
  Stream::writeU32(stream,0xc);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  val = (int)*(char *)((long)&this->width + (long)iVar1 + 3);
  Stream::writeI32(stream,this->format);
  Stream::writeI32(stream,this->width);
  Stream::writeI32(stream,this->height);
  Stream::writeI32(stream,this->depth);
  Stream::writeI32(stream,val);
  bVar5 = (*(byte *)((long)&this->width + (long)iVar1 + 1) & 1) != 0;
  if ((*(byte *)((long)&this->width + (long)iVar1) & 1) != 0) {
    bVar5 = bVar5 | 2;
  }
  size = (uint32)bVar5;
  Stream::writeI32(stream,gl3Caps);
  Stream::writeI32(stream,size);
  Stream::writeI32(stream,0);
  uVar4 = extraout_RDX;
  for (local_4c = 0; (int)local_4c < val; local_4c = local_4c + 1) {
    uVar2 = getLevelSize((gl3 *)this,(Raster *)(ulong)local_4c,(int32)uVar4);
    Stream::writeU32(stream,uVar2);
    puVar3 = Raster::lock(this,local_4c,2);
    (*stream->_vptr_Stream[3])(stream,puVar3,(ulong)uVar2);
    Raster::unlock(this,local_4c);
    uVar4 = extraout_RDX_00;
  }
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	Raster *raster = tex->raster;
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_GL3);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	int32 numLevels = natras->numLevels;
	stream->writeI32(raster->format);
	stream->writeI32(raster->width);
	stream->writeI32(raster->height);
	stream->writeI32(raster->depth);
	stream->writeI32(numLevels);

	// Native raster
	int32 flags = 0;
	int32 compression = 0;
	if(natras->hasAlpha)
		flags |= 1;
	if(natras->isCompressed){
		flags |= 2;
		switch(natras->internalFormat){
#ifdef RW_OPENGL
		case GL_COMPRESSED_RGBA_S3TC_DXT1_EXT:
		case GL_COMPRESSED_RGB_S3TC_DXT1_EXT:
			compression = 1;
			break;
		case GL_COMPRESSED_RGBA_S3TC_DXT3_EXT:
			compression = 3;
			break;
		case GL_COMPRESSED_RGBA_S3TC_DXT5_EXT:
			compression = 5;
			break;
#endif
		default:
			assert(0 && "unknown compression");
		}
	}
	stream->writeI32(gl3Caps.gles);
	stream->writeI32(flags);
	stream->writeI32(compression);
	// TODO: auto mipmaps?

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = getLevelSize(raster, i);
		stream->writeU32(size);
		data = raster->lock(i, Raster::LOCKREAD);
		stream->write8(data, size);
		raster->unlock(i);
	}
}